

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerHLSL::to_func_call_arg_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,Parameter *arg,uint32_t id)

{
  SPIRType *pSVar1;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  CompilerGLSL::to_func_call_arg_abi_cxx11_(__return_storage_ptr__,&this->super_CompilerGLSL,arg,id)
  ;
  if (0x1e < (this->hlsl_options).shader_model) {
    pSVar1 = Compiler::expression_type((Compiler *)this,id);
    if ((*(int *)&(pSVar1->super_IVariant).field_0xc == 0x11) && ((pSVar1->image).dim != DimBuffer))
    {
      to_sampler_expression_abi_cxx11_(&sStack_58,this,id);
      ::std::operator+(&local_38,", ",&sStack_58);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_38);
      ::std::__cxx11::string::~string((string *)&sStack_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::to_func_call_arg(const SPIRFunction::Parameter &arg, uint32_t id)
{
	string arg_str = CompilerGLSL::to_func_call_arg(arg, id);

	if (hlsl_options.shader_model <= 30)
		return arg_str;

	// Manufacture automatic sampler arg if the arg is a SampledImage texture and we're in modern HLSL.
	auto &type = expression_type(id);

	// We don't have to consider combined image samplers here via OpSampledImage because
	// those variables cannot be passed as arguments to functions.
	// Only global SampledImage variables may be used as arguments.
	if (type.basetype == SPIRType::SampledImage && type.image.dim != DimBuffer)
		arg_str += ", " + to_sampler_expression(id);

	return arg_str;
}